

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_console.cpp
# Opt level: O2

int __thiscall crnlib::console::vprintf(console *this,char *__format,__gnuc_va_list __arg)

{
  bool bVar1;
  byte bVar2;
  int extraout_EAX;
  size_t sVar3;
  char *pcVar4;
  int iVar5;
  byte bVar6;
  char *pcVar7;
  uint i;
  ulong uVar8;
  long lVar9;
  scoped_mutex lock;
  dynamic_string tmp_buf;
  char buf [4096];
  
  init((EVP_PKEY_CTX *)this);
  lock.m_mutex = m_pMutex;
  mutex::lock(m_pMutex);
  iVar5 = (int)this;
  *(int *)(m_num_messages + ((ulong)this & 0xffffffff) * 4) =
       *(int *)(m_num_messages + ((ulong)this & 0xffffffff) * 4) + 1;
  vsprintf_s(buf,0x1000,__format,(__va_list_tag *)__arg);
  if (DAT_001b7958 == 0) {
    bVar6 = 0;
  }
  else {
    lVar9 = 8;
    bVar6 = 0;
    for (uVar8 = 0; uVar8 < DAT_001b7958; uVar8 = uVar8 + 1) {
      bVar2 = (**(code **)(m_output_funcs + -8 + lVar9))
                        ((ulong)this & 0xffffffff,buf,*(undefined8 *)(m_output_funcs + lVar9));
      bVar6 = bVar6 | bVar2;
      lVar9 = lVar9 + 0x10;
    }
  }
  bVar1 = true;
  if ((m_prefixes == '\x01') && (m_at_beginning_of_line == '\x01')) {
    if (iVar5 == 6) {
      pcVar7 = "Error: ";
    }
    else if (iVar5 == 5) {
      pcVar7 = "Warning: ";
    }
    else {
      if (iVar5 != 0) goto LAB_0010dbc6;
      pcVar7 = "Debug: ";
    }
    bVar1 = false;
  }
  else {
LAB_0010dbc6:
    pcVar7 = (char *)0x0;
  }
  if (((bVar6 | m_output_disabled) & 1) == 0) {
    if (!bVar1) {
      ::printf("%s",pcVar7);
    }
    pcVar7 = "%s";
    if (m_crlf != '\0') {
      pcVar7 = "%s\n";
    }
    ::printf(pcVar7,buf);
  }
  sVar3 = strlen(buf);
  m_at_beginning_of_line = true;
  if (m_crlf == '\0') {
    if ((int)sVar3 == 0) {
      m_at_beginning_of_line = false;
    }
    else {
      m_at_beginning_of_line = buf[(int)sVar3 - 1] == '\n';
    }
  }
  if ((iVar5 != 1) && (m_pLog_stream != (data_stream *)0x0)) {
    dynamic_string::dynamic_string(&tmp_buf,buf);
    dynamic_string::translate_lf_to_crlf(&tmp_buf);
    pcVar7 = "%s";
    if (m_crlf != '\0') {
      pcVar7 = "%s\r\n";
    }
    pcVar4 = "";
    if (tmp_buf.m_pStr != (char *)0x0) {
      pcVar4 = tmp_buf.m_pStr;
    }
    data_stream::printf(m_pLog_stream,pcVar7,pcVar4);
    (*m_pLog_stream->_vptr_data_stream[7])();
    dynamic_string::~dynamic_string(&tmp_buf);
  }
  scoped_mutex::~scoped_mutex(&lock);
  return extraout_EAX;
}

Assistant:

void console::vprintf(eConsoleMessageType type, const char* p, va_list args) {
  init();

  scoped_mutex lock(*m_pMutex);

  m_num_messages[type]++;

  char buf[cConsoleBufSize];
  vsprintf_s(buf, cConsoleBufSize, p, args);

  bool handled = false;

  if (m_output_funcs.size()) {
    for (uint i = 0; i < m_output_funcs.size(); i++)
      if (m_output_funcs[i].m_func(type, buf, m_output_funcs[i].m_pData))
        handled = true;
  }

  const char* pPrefix = NULL;
  if ((m_prefixes) && (m_at_beginning_of_line)) {
    switch (type) {
      case cDebugConsoleMessage:
        pPrefix = "Debug: ";
        break;
      case cWarningConsoleMessage:
        pPrefix = "Warning: ";
        break;
      case cErrorConsoleMessage:
        pPrefix = "Error: ";
        break;
      default:
        break;
    }
  }

  if ((!m_output_disabled) && (!handled)) {
    if (pPrefix)
      ::printf("%s", pPrefix);
    ::printf(m_crlf ? "%s\n" : "%s", buf);
  }

  uint n = strlen(buf);
  m_at_beginning_of_line = (m_crlf) || ((n) && (buf[n - 1] == '\n'));

  if ((type != cProgressConsoleMessage) && (m_pLog_stream)) {
    // Yes this is bad.
    dynamic_string tmp_buf(buf);

    tmp_buf.translate_lf_to_crlf();

    m_pLog_stream->printf(m_crlf ? "%s\r\n" : "%s", tmp_buf.get_ptr());
    m_pLog_stream->flush();
  }
}